

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O0

void __thiscall
amrex::FluxRegister::FineAdd
          (FluxRegister *this,MultiFab *mflx,int dir,int srccomp,int destcomp,int numcomp,Real mult)

{
  bool bVar1;
  int __c;
  FArrayBox *in_RSI;
  undefined4 in_R9D;
  int k;
  MFIter mfi;
  Real in_stack_00000190;
  int in_stack_00000198;
  int in_stack_0000019c;
  int in_stack_000001a0;
  int in_stack_000001a4;
  FArrayBox *in_stack_000001a8;
  FluxRegister *in_stack_000001b0;
  int in_stack_000004d0;
  RunOn in_stack_000004d8;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  uchar in_stack_ffffffffffffff87;
  FabArrayBase *in_stack_ffffffffffffff88;
  MFIter *in_stack_ffffffffffffff90;
  
  MFIter::MFIter(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff87);
  while( true ) {
    bVar1 = MFIter::isValid((MFIter *)&stack0xffffffffffffff78);
    if (!bVar1) break;
    MFIter::index((MFIter *)&stack0xffffffffffffff78,(char *)in_RSI,__c);
    in_RSI = FabArray<amrex::FArrayBox>::operator[]
                       ((FabArray<amrex::FArrayBox> *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        (MFIter *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    in_stack_ffffffffffffff60 = 0;
    in_stack_ffffffffffffff58 = in_R9D;
    FineAdd(in_stack_000001b0,in_stack_000001a8,in_stack_000001a4,in_stack_000001a0,
            in_stack_0000019c,in_stack_00000198,in_stack_000004d0,in_stack_00000190,
            in_stack_000004d8);
    MFIter::operator++((MFIter *)&stack0xffffffffffffff78);
  }
  MFIter::~MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  return;
}

Assistant:

void
FluxRegister::FineAdd (const MultiFab& mflx,
                       int             dir,
                       int             srccomp,
                       int             destcomp,
                       int             numcomp,
                       Real            mult)
{
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mflx); mfi.isValid(); ++mfi)
    {
        const int k = mfi.index();
        FineAdd(mflx[mfi],dir,k,srccomp,destcomp,numcomp,mult,RunOn::Gpu);
    }
}